

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RepeatLoopFixedGroupLastIterationInst::Exec
          (RepeatLoopFixedGroupLastIterationInst *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  char *pcVar1;
  int iVar2;
  Label LVar3;
  uint uVar4;
  Type TVar5;
  long lVar6;
  LoopInfo *pLVar7;
  GroupInfo *pGVar8;
  PageAllocation *pPVar9;
  size_t sVar10;
  code *pcVar11;
  bool bVar12;
  uint uVar13;
  undefined4 *puVar14;
  char *pcVar15;
  Program *pPVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  
  uVar17 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  if ((ulong)(((matcher->program).ptr)->rep).insts.instsLen < uVar17 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                        "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar12) goto LAB_00f0e2f9;
    *puVar14 = 0;
  }
  if ((((matcher->program).ptr)->rep).insts.insts.ptr[uVar17] != 'N') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                        "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar12) goto LAB_00f0e2f9;
    *puVar14 = 0;
  }
  pPVar16 = (matcher->program).ptr;
  lVar6 = *(long *)&pPVar16->rep;
  iVar2 = *(int *)(lVar6 + 1 + uVar17);
  lVar19 = (long)iVar2;
  if ((lVar19 < 0) || (pPVar16->numLoops <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                        "loopId >= 0 && loopId < program->numLoops");
    if (!bVar12) goto LAB_00f0e2f9;
    *puVar14 = 0;
  }
  pLVar7 = (matcher->loopInfos).ptr;
  uVar13 = pLVar7[lVar19].number + 1;
  pLVar7[lVar19].number = uVar13;
  uVar18 = *(uint *)(lVar6 + 5 + uVar17);
  if (uVar13 < uVar18) {
    LVar3 = (this->super_RepeatLoopMixin).beginLabel;
LAB_00f0e27b:
    uVar18 = LVar3 + 0x1c;
    pPVar16 = (matcher->program).ptr;
  }
  else {
    uVar4 = *(uint *)(lVar6 + 9 + uVar17);
    if ((uVar4 == 0xffffffff) || (uVar13 < uVar4)) {
      if (uVar13 == uVar18) {
        if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize -
            (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop < 0x20) {
          ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
        }
        if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                              ,199,"(bufferSize)","bufferSize");
          if (!bVar12) goto LAB_00f0e2f9;
          *puVar14 = 0;
        }
        pPVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.pageAllocation;
        sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x20;
        *(size_t *)((long)&pPVar9[1].pageCount + sVar10) =
             (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             topElementSize;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        topElementSize = 0x20;
        LVar3 = (this->super_RepeatLoopMixin).beginLabel;
        *(undefined1 *)((long)&pPVar9[2].pageCount + sVar10) = 10;
        *(undefined ***)((long)&pPVar9[1].segment + sVar10) = &PTR_Print_01559938;
        *(Label *)((long)&pPVar9[2].pageCount + sVar10 + 4) = LVar3;
        *(undefined1 *)((long)&pPVar9[2].segment + sVar10) = 1;
        Matcher::PushStats(matcher,contStack,input);
      }
      LVar3 = (this->super_RepeatLoopMixin).beginLabel;
      goto LAB_00f0e27b;
    }
    if (uVar18 < uVar4) {
      pcVar15 = ContinuousPageStack<1UL>::Top
                          ((ContinuousPageStack<1UL> *)contStack,
                           (contStack->
                           super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                           topElementSize);
      pcVar1 = pcVar15 + 8;
      if (pcVar15 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                            ,0xe3b,"(top != 0)","top != 0");
        if (!bVar12) goto LAB_00f0e2f9;
        *puVar14 = 0;
        pcVar1 = (char *)0x0;
      }
      if (pcVar1[8] != '\n') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                            ,0xe3c,"(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration)",
                            "top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration");
        if (!bVar12) goto LAB_00f0e2f9;
        *puVar14 = 0;
      }
      pcVar1[0x10] = '\0';
    }
    iVar2 = *(int *)(lVar6 + 0x17 + uVar17);
    lVar19 = (long)iVar2;
    if ((lVar19 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                          ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                          "groupId >= 0 && groupId < program->numGroups");
      if (!bVar12) goto LAB_00f0e2f9;
      *puVar14 = 0;
    }
    pGVar8 = (matcher->groupInfos).ptr;
    TVar5 = *(Type *)(lVar6 + 0x13 + uVar17);
    pGVar8[lVar19].offset = *inputOffset - TVar5;
    pGVar8[lVar19].length = TVar5;
    uVar18 = *(uint *)(lVar6 + 0xf + uVar17);
    pPVar16 = (matcher->program).ptr;
  }
  if ((pPVar16->rep).insts.instsLen <= uVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x76d,"(label < program->rep.insts.instsLen)",
                        "label < program->rep.insts.instsLen");
    if (!bVar12) {
LAB_00f0e2f9:
      pcVar11 = (code *)invalidInstructionException();
      (*pcVar11)();
    }
    *puVar14 = 0;
  }
  *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar18;
  return false;
}

Assistant:

inline bool RepeatLoopFixedGroupLastIterationInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration);
                RewindLoopFixedGroupLastIterationCont* rewind = (RewindLoopFixedGroupLastIterationCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation

            // Bind group
            GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;

            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedGroupLastIterationCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        return false;
    }